

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-port.h
# Opt level: O0

pthread_key_t
testing::internal::ThreadLocal<testing::TestPartResultReporterInterface_*>::CreateKey(void)

{
  ostream *poVar1;
  GTestLog local_14;
  int local_10;
  pthread_key_t local_c;
  int gtest_error;
  pthread_key_t key;
  
  local_10 = pthread_key_create(&local_c,DeleteThreadLocalValue);
  if (local_10 != 0) {
    GTestLog::GTestLog(&local_14,GTEST_FATAL,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/googletest/googletest/include/gtest/internal/gtest-port.h"
                       ,0x8a1);
    poVar1 = GTestLog::GetStream(&local_14);
    poVar1 = std::operator<<(poVar1,"pthread_key_create(&key, &DeleteThreadLocalValue)");
    poVar1 = std::operator<<(poVar1,"failed with error ");
    std::ostream::operator<<(poVar1,local_10);
    GTestLog::~GTestLog(&local_14);
  }
  return local_c;
}

Assistant:

static pthread_key_t CreateKey() {
    pthread_key_t key;
    // When a thread exits, DeleteThreadLocalValue() will be called on
    // the object managed for that thread.
    GTEST_CHECK_POSIX_SUCCESS_(
        pthread_key_create(&key, &DeleteThreadLocalValue));
    return key;
  }